

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_column_schema.hpp
# Opt level: O0

void __thiscall duckdb::ParquetColumnSchema::ParquetColumnSchema(ParquetColumnSchema *this)

{
  long in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 8));
  duckdb::LogicalType::LogicalType((LogicalType *)(in_RDI + 0x28));
  optional_idx::optional_idx((optional_idx *)(in_RDI + 0x60));
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0x70) = 1;
  *(undefined4 *)(in_RDI + 0x74) = 0;
  vector<duckdb::ParquetColumnSchema,_true>::vector
            ((vector<duckdb::ParquetColumnSchema,_true> *)0x688eb0);
  return;
}

Assistant:

ParquetColumnSchema() = default;